

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void __thiscall MasterObjectHolder::deleteAll(MasterObjectHolder *this)

{
  bool bVar1;
  pointer pFVar2;
  pointer pAVar3;
  pointer pCVar4;
  element_type *peVar5;
  pointer pBVar6;
  element_type *peVar7;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *brk;
  iterator __end1_3;
  iterator __begin1_3;
  handle *__range1_3;
  handle brokerHandle;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *core;
  iterator __end1_2;
  iterator __begin1_2;
  handle *__range1_2;
  handle coreHandle;
  unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *app;
  iterator __end1_1;
  iterator __begin1_1;
  handle *__range1_1;
  handle appHandle;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  iterator __end1;
  iterator __begin1;
  handle *__range1;
  handle fedHandle;
  guarded<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  *in_stack_fffffffffffffde8;
  _Deque_iterator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_&,_std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_*>
  *in_stack_fffffffffffffdf0;
  _Deque_iterator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_&,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_*>
  *this_00;
  HelicsError *in_stack_fffffffffffffdf8;
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  *plVar8;
  HelicsApp in_stack_fffffffffffffe00;
  lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  *this_01;
  lock_handle<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  local_1d0;
  reference local_1b8;
  _Self local_1b0;
  _Self local_190;
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  *local_170;
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  local_168;
  reference local_150;
  _Self local_148;
  _Self local_128;
  undefined1 *local_108;
  Federate *in_stack_ffffffffffffff00;
  _Self local_e0;
  _Self local_c0;
  lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  *local_a0;
  lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
  local_98;
  reference local_80;
  _Self local_78;
  _Self local_48;
  lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  *local_28;
  lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  local_20;
  
  bVar1 = gmlc::concurrency::TripWireDetector::isTripped((TripWireDetector *)0x1a3868);
  if (!bVar1) {
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
    ::lock((guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
            *)in_stack_fffffffffffffde8);
    local_28 = &local_20;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
    ::begin((lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
             *)in_stack_fffffffffffffde8);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
    ::end((lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
           *)in_stack_fffffffffffffde8);
    while (bVar1 = std::operator==(&local_48,&local_78), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_80 = std::
                 _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
                 ::operator*(&local_48);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                         0x1a3910);
      if (bVar1) {
        pFVar2 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::
                 operator->((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>
                             *)0x1a3923);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pFVar2->fedptr);
        if (bVar1) {
          pFVar2 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::
                   operator->((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>
                               *)0x1a3942);
          pFVar2->valid = 0;
          std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
                    ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                     0x1a3956);
          std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a3962);
          helics::Federate::finalize(in_stack_ffffffffffffff00);
        }
      }
      std::
      _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
      ::operator++((_Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
                    *)in_stack_fffffffffffffdf0);
    }
    this_01 = &local_20;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
    ::operator->(this_01);
    std::
    deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             *)this_01);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
                    *)0x1a39cc);
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::lock((guarded<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
            *)in_stack_fffffffffffffde8);
    local_a0 = &local_98;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::begin((lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
             *)in_stack_fffffffffffffde8);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::end((lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
           *)in_stack_fffffffffffffde8);
    while (bVar1 = std::operator==(&local_c0,&local_e0), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Deque_iterator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_&,_std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_*>
      ::operator*(&local_c0);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                         0x1a3a69);
      if (bVar1) {
        pAVar3 = std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::
                 operator->((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>
                             *)0x1a3a7c);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pAVar3->app);
        if (bVar1) {
          std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::get
                    ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                     in_stack_fffffffffffffdf0);
          helicsAppFinalize(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          pAVar3 = std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::
                   operator->((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>
                               *)0x1a3ab6);
          pAVar3->valid = 0;
        }
      }
      std::
      _Deque_iterator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_&,_std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_*>
      ::operator++(in_stack_fffffffffffffdf0);
    }
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::operator->(&local_98);
    std::
    deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
             *)this_01);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
                    *)0x1a3b1d);
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
    ::lock((guarded<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
            *)in_stack_fffffffffffffde8);
    local_108 = &stack0xffffffffffffff00;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
    ::begin((lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
             *)in_stack_fffffffffffffde8);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
    ::end((lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
           *)in_stack_fffffffffffffde8);
    while (bVar1 = std::operator==(&local_128,&local_148), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_150 = std::
                  _Deque_iterator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_&,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_*>
                  ::operator*(&local_128);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *
                         )0x1a3bb7);
      if (bVar1) {
        pCVar4 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::
                 operator->((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                             *)0x1a3bca);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pCVar4);
        if (bVar1) {
          pCVar4 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::
                   operator->((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                               *)0x1a3be5);
          pCVar4->valid = 0;
          std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::operator->
                    ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                     0x1a3bf9);
          peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1a3c01);
          (*peVar5->_vptr_Core[8])();
        }
      }
      std::
      _Deque_iterator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_&,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_*>
      ::operator++((_Deque_iterator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_&,_std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_*>
                    *)in_stack_fffffffffffffdf0);
    }
    this_00 = (_Deque_iterator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_&,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_*>
               *)&stack0xffffffffffffff00;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
    ::operator->((lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
                  *)this_00);
    std::
    deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
             *)this_01);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
                    *)0x1a3c6f);
    plVar8 = &local_168;
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::lock((guarded<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
            *)in_stack_fffffffffffffde8);
    local_170 = plVar8;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::begin((lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
             *)in_stack_fffffffffffffde8);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::end((lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
           *)in_stack_fffffffffffffde8);
    while (bVar1 = std::operator==(&local_190,&local_1b0), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_1b8 = std::
                  _Deque_iterator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_&,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_*>
                  ::operator*(&local_190);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)0x1a3cf9);
      if (bVar1) {
        pBVar6 = std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::
                 operator->((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                             *)0x1a3d09);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pBVar6);
        if (bVar1) {
          pBVar6 = std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                   ::operator->((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                 *)0x1a3d21);
          pBVar6->valid = 0;
          std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::
          operator->((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *
                     )0x1a3d32);
          peVar7 = std::
                   __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a3d3a);
          (*peVar7->_vptr_Broker[3])();
        }
      }
      std::
      _Deque_iterator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_&,_std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_*>
      ::operator++(this_00);
    }
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::operator->(&local_168);
    std::
    deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
             *)this_01);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
                    *)0x1a3da3);
    gmlc::libguarded::
    guarded<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
    ::lock(in_stack_fffffffffffffde8);
    gmlc::libguarded::
    lock_handle<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
    ::operator->(&local_1d0);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
    gmlc::libguarded::
    lock_handle<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
                    *)0x1a3dd5);
  }
  return;
}

Assistant:

void MasterObjectHolder::deleteAll()
{
    if (tripDetect.isTripped()) {
        return;
    }
    // brackets are for the scopes on the lock handles
    {
        auto fedHandle = feds.lock();
        for (auto& fed : fedHandle) {
            if ((fed) && (fed->fedptr)) {
                fed->valid = 0;
                fed->fedptr->finalize();
            }
        }
        fedHandle->clear();
    }
    {
        auto appHandle = apps.lock();
        for (auto& app : appHandle) {
            if ((app) && (app->app)) {
                helicsAppFinalize(reinterpret_cast<HelicsApp>(app.get()), nullptr);
                app->valid = 0;
            }
        }
        appHandle->clear();
    }
    {
        auto coreHandle = cores.lock();
        for (auto& core : coreHandle) {
            if ((core) && (core->coreptr)) {
                core->valid = 0;
                core->coreptr->disconnect();
            }
        }
        coreHandle->clear();
    }
    {
        auto brokerHandle = brokers.lock();
        for (auto& brk : brokerHandle) {
            if ((brk) && (brk->brokerptr)) {
                brk->valid = 0;
                brk->brokerptr->disconnect();
            }
        }
        brokerHandle->clear();
    }
    errorStrings.lock()->clear();
}